

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool httplib::detail::read_content_chunked(Stream *strm,string *out)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  __ssize_t _Var4;
  FILE *pFVar5;
  char *pcVar6;
  undefined8 *puVar7;
  undefined8 uVar8;
  FILE *in_RCX;
  FILE *pFVar9;
  size_t *in_RDX;
  size_t *extraout_RDX;
  size_t *extraout_RDX_00;
  size_t *extraout_RDX_01;
  size_t *extraout_RDX_02;
  size_t *extraout_RDX_03;
  size_t *extraout_RDX_04;
  size_t *extraout_RDX_05;
  size_t *__n;
  size_t *extraout_RDX_06;
  size_t *__n_00;
  size_t *extraout_RDX_07;
  bool bVar10;
  FILE *__endptr;
  int iVar11;
  FILE *pFVar12;
  string chunk;
  stream_line_reader reader;
  char buf [16];
  allocator local_119;
  FILE *local_118;
  int local_10c;
  FILE *local_108;
  undefined8 local_100;
  undefined1 local_f8;
  undefined7 uStack_f7;
  char *local_e8;
  FILE *local_e0;
  undefined1 local_d8 [16];
  char *local_c8;
  undefined1 local_b8 [32];
  FILE *local_98 [2];
  char *local_88 [2];
  _IO_FILE *local_78;
  char *pcStack_70;
  code *local_68;
  code *pcStack_60;
  _IO_FILE *local_50;
  char local_48 [24];
  
  local_b8._0_8_ = local_b8 + 0x10;
  local_d8._8_8_ = local_48;
  local_c8 = (char *)0x10;
  local_b8._8_8_ = (char *)0x0;
  local_b8[0x10] = '\0';
  local_d8._0_8_ = strm;
  _Var4 = stream_line_reader::getline((stream_line_reader *)local_d8,(char **)out,in_RDX,in_RCX);
  if ((char)_Var4 == '\0') goto LAB_00149c05;
  puVar7 = (undefined8 *)local_b8;
  if ((char *)local_b8._8_8_ == (char *)0x0) {
    puVar7 = (undefined8 *)(local_d8 + 8);
  }
  std::__cxx11::string::string((string *)&local_108,(char *)*puVar7,(allocator *)&local_e0);
  pFVar9 = local_108;
  pFVar5 = (FILE *)__errno_location();
  iVar2 = pFVar5->_flags;
  pFVar5->_flags = 0;
  __endptr = (FILE *)local_98;
  pcVar6 = (char *)strtol((char *)pFVar9,(char **)__endptr,0x10);
  local_118 = pFVar5;
  if (local_98[0] == pFVar9) {
    std::__throw_invalid_argument("stoi");
LAB_00149c41:
    std::__throw_out_of_range("stoi");
LAB_00149c4d:
    std::__throw_invalid_argument("stoi");
LAB_00149c59:
    uVar8 = std::__throw_out_of_range("stoi");
    if (local_108 != (FILE *)&local_f8) {
      operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
    }
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
    }
    _Unwind_Resume(uVar8);
  }
  if ((char *)(long)(int)pcVar6 != pcVar6) goto LAB_00149c41;
  uVar3 = pFVar5->_flags;
  pFVar9 = (FILE *)(ulong)uVar3;
  if (uVar3 == 0x22) goto LAB_00149c41;
  if (uVar3 == 0) {
    pFVar5->_flags = iVar2;
  }
  __n_00 = extraout_RDX;
  local_e8 = pcVar6;
  local_50 = (_IO_FILE *)out;
  if (local_108 != (FILE *)&local_f8) {
    __endptr = (FILE *)(CONCAT71(uStack_f7,local_f8) + 1);
    operator_delete(local_108,(ulong)__endptr);
    __n_00 = extraout_RDX_00;
  }
  do {
    iVar2 = (int)local_e8;
    if (iVar2 < 1) goto LAB_00149bb3;
    local_100 = 0;
    local_f8 = 0;
    pFVar12 = (FILE *)((ulong)local_e8 & 0xffffffff);
    local_78 = (_IO_FILE *)0x0;
    pcStack_70 = (char *)0x0;
    local_68 = (code *)0x0;
    pcStack_60 = (code *)0x0;
    pFVar9 = pFVar12;
    local_108 = (FILE *)&local_f8;
    std::__cxx11::string::_M_replace_aux((ulong)&local_108,0,0,(char)pFVar12);
    pFVar5 = (FILE *)0x0;
    do {
      __endptr = (FILE *)((long)&pFVar5->_flags + (long)&local_108->_flags);
      uVar3 = (*strm->_vptr_Stream[2])(strm,__endptr,(long)pFVar12 - (long)pFVar5);
      __n_00 = extraout_RDX_01;
      if (((int)uVar3 < 1) ||
         ((pFVar5 = (FILE *)((long)&pFVar5->_flags + (ulong)uVar3), local_68 != (code *)0x0 &&
          (__endptr = (FILE *)local_98, local_e0 = pFVar12, local_98[0] = pFVar5,
          cVar1 = (*pcStack_60)((FILE *)&local_78,(FILE *)local_98,(FILE *)&local_e0),
          __n_00 = extraout_RDX_02, cVar1 == '\0')))) {
        bVar10 = false;
        goto LAB_00149a33;
      }
    } while (pFVar5 < pFVar12);
    bVar10 = true;
LAB_00149a33:
    if (local_68 != (code *)0x0) {
      __endptr = (FILE *)&local_78;
      (*local_68)((FILE *)&local_78,(FILE *)&local_78,3);
      __n_00 = extraout_RDX_03;
    }
    iVar11 = 1;
    if ((bVar10) &&
       (_Var4 = stream_line_reader::getline
                          ((stream_line_reader *)local_d8,(char **)__endptr,__n_00,pFVar9),
       __n_00 = extraout_RDX_04, (char)_Var4 != '\0')) {
      pFVar9 = (FILE *)(local_d8 + 8);
      pFVar5 = (FILE *)local_b8;
      if ((char *)local_b8._8_8_ == (char *)0x0) {
        pFVar5 = pFVar9;
      }
      pcVar6 = *(char **)pFVar5;
      if (((*pcVar6 == '\r') && (pcVar6[1] == '\n')) && (pcVar6[2] == '\0')) {
        __endptr = local_108;
        std::__cxx11::string::_M_append((char *)local_50,(ulong)local_108);
        _Var4 = stream_line_reader::getline
                          ((stream_line_reader *)local_d8,(char **)__endptr,__n,pFVar9);
        __n_00 = extraout_RDX_06;
        if ((char)_Var4 != '\0') {
          puVar7 = (undefined8 *)local_b8;
          if ((char *)local_b8._8_8_ == (char *)0x0) {
            puVar7 = (undefined8 *)(local_d8 + 8);
          }
          std::__cxx11::string::string((string *)local_98,(char *)*puVar7,&local_119);
          pFVar9 = local_98[0];
          local_10c = local_118->_flags;
          local_118->_flags = 0;
          __endptr = (FILE *)&local_e0;
          pcVar6 = (char *)strtol((char *)local_98[0],(char **)&local_e0,0x10);
          if (local_e0 == pFVar9) goto LAB_00149c4d;
          if (pcVar6 + -0x80000000 < (char *)0xffffffff00000000) goto LAB_00149c59;
          uVar3 = local_118->_flags;
          __n_00 = (size_t *)(ulong)uVar3;
          if (uVar3 == 0x22) goto LAB_00149c59;
          if (uVar3 == 0) {
            local_118->_flags = local_10c;
          }
          pFVar9 = local_118;
          local_e8 = pcVar6;
          if (local_98[0] != (FILE *)local_88) {
            __endptr = (FILE *)(local_88[0] + 1);
            operator_delete(local_98[0],(ulong)__endptr);
            __n_00 = extraout_RDX_07;
          }
          iVar11 = 0;
        }
      }
      else {
        iVar11 = 3;
      }
    }
    if (local_108 != (FILE *)&local_f8) {
      __endptr = (FILE *)(CONCAT71(uStack_f7,local_f8) + 1);
      operator_delete(local_108,(ulong)__endptr);
      __n_00 = extraout_RDX_05;
    }
  } while (iVar11 == 0);
  iVar2 = (int)local_e8;
  if (iVar11 != 3) {
    bVar10 = false;
    goto LAB_00149c07;
  }
LAB_00149bb3:
  if (iVar2 == 0) {
    _Var4 = stream_line_reader::getline
                      ((stream_line_reader *)local_d8,(char **)__endptr,__n_00,pFVar9);
    if ((char)_Var4 != '\0') {
      puVar7 = (undefined8 *)local_b8;
      if ((char *)local_b8._8_8_ == (char *)0x0) {
        puVar7 = (undefined8 *)(local_d8 + 8);
      }
      pcVar6 = (char *)*puVar7;
      if (((*pcVar6 == '\r') && (pcVar6[1] == '\n')) && (pcVar6[2] == '\0')) goto LAB_00149bbf;
    }
LAB_00149c05:
    bVar10 = false;
  }
  else {
LAB_00149bbf:
    bVar10 = true;
  }
LAB_00149c07:
  if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
    operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
  }
  return bVar10;
}

Assistant:

inline bool read_content_chunked(Stream& strm, std::string& out)
{
    const auto bufsiz = 16;
    char buf[bufsiz];

    stream_line_reader reader(strm, buf, bufsiz);

    if (!reader.getline()) {
        return false;
    }

    auto chunk_len = std::stoi(reader.ptr(), 0, 16);

    while (chunk_len > 0){
        std::string chunk;
        if (!read_content_with_length(strm, chunk, chunk_len, nullptr)) {
            return false;
        }

        if (!reader.getline()) {
            return false;
        }

        if (strcmp(reader.ptr(), "\r\n")) {
            break;
        }

        out += chunk;

        if (!reader.getline()) {
            return false;
        }

        chunk_len = std::stoi(reader.ptr(), 0, 16);
    }

    if (chunk_len == 0) {
        // Reader terminator after chunks
        if (!reader.getline() || strcmp(reader.ptr(), "\r\n"))
            return false;
    }

    return true;
}